

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
CMU462::HDRImageBuffer::toColor
          (HDRImageBuffer *this,ImageBuffer *target,size_t x0,size_t y0,size_t x1,size_t y1)

{
  size_t this_00;
  __type_conflict __x;
  double dVar1;
  Color local_7c;
  float local_6c;
  float local_68;
  float b;
  float g;
  float r;
  Spectrum *s;
  size_t x;
  size_t y;
  float exposure;
  float one_over_gamma;
  float level;
  float gamma;
  size_t y1_local;
  size_t x1_local;
  size_t y0_local;
  size_t x0_local;
  ImageBuffer *target_local;
  HDRImageBuffer *this_local;
  
  one_over_gamma = 2.2;
  exposure = 1.0;
  y._4_4_ = 0x3ee8ba2e;
  _level = y1;
  y1_local = x1;
  x1_local = y0;
  y0_local = x0;
  x0_local = (size_t)target;
  target_local = (ImageBuffer *)this;
  __x = std::pow<int,float>(2,1.0);
  dVar1 = sqrt(__x);
  y._0_4_ = (float)dVar1;
  for (x = x1_local; x < _level; x = x + 1) {
    for (s = (Spectrum *)y0_local; s < y1_local; s = (Spectrum *)((long)&s->r + 1)) {
      _g = std::vector<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>::operator[]
                     (&this->data,(size_type)((long)&s->r + x * this->w));
      dVar1 = std::pow((double)(ulong)(uint)(_g->r * (float)y),(double)(ulong)y._4_4_);
      b = SUB84(dVar1,0);
      dVar1 = std::pow((double)(ulong)(uint)(_g->g * (float)y),(double)(ulong)y._4_4_);
      local_68 = SUB84(dVar1,0);
      dVar1 = std::pow((double)(ulong)(uint)(_g->b * (float)y),(double)(ulong)y._4_4_);
      this_00 = x0_local;
      local_6c = SUB84(dVar1,0);
      Color::Color(&local_7c,b,local_68,local_6c,1.0);
      ImageBuffer::update_pixel((ImageBuffer *)this_00,&local_7c,(size_t)s,x);
    }
  }
  return;
}

Assistant:

void toColor(ImageBuffer& target, size_t x0, size_t y0, size_t x1, size_t y1) {

      float gamma = 2.2f;
      float level = 1.0f;
      float one_over_gamma = 1.0f / gamma;
      float exposure = sqrt(pow(2,level));
      for (size_t y = y0; y < y1; ++y) {
        for (size_t x = x0; x < x1; ++x) {
          const Spectrum& s = data[x + y * w];
          float r = pow(s.r * exposure, one_over_gamma);
          float g = pow(s.g * exposure, one_over_gamma);
          float b = pow(s.b * exposure, one_over_gamma);
          target.update_pixel(Color(r, g, b, 1.0), x, y);
        }
      }
    }